

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infix_iterator.h
# Opt level: O3

infix_ostream_iterator<double,_char,_std::char_traits<char>_> * __thiscall
Nova::infix_ostream_iterator<double,_char,_std::char_traits<char>_>::operator=
          (infix_ostream_iterator<double,_char,_std::char_traits<char>_> *this,double *item)

{
  char *__s;
  ostream *poVar1;
  size_t sVar2;
  
  if ((this->first_elem == false) && (__s = this->delimiter, __s != (char *)0x0)) {
    poVar1 = this->os;
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  std::ostream::_M_insert<double>(*item);
  this->first_elem = false;
  return this;
}

Assistant:

infix_ostream_iterator<T,charT,traits>& operator=(T const &item)
    {
        // Here's the only real change from ostream_iterator:
        // Normally, the '*os << item;' would come before the 'if'.
        if (!first_elem && delimiter != 0) *os << delimiter;
        *os << item;
        first_elem = false;
        return *this;
    }